

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QXmlStreamAttribute>::emplace<QXmlStreamAttribute>
          (QMovableArrayOps<QXmlStreamAttribute> *this,qsizetype i,QXmlStreamAttribute *args)

{
  QXmlStreamAttribute **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_c0;
  QXmlStreamAttribute tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QXmlStreamAttribute>).
           super_QArrayDataPointer<QXmlStreamAttribute>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QXmlStreamAttribute>).
        super_QArrayDataPointer<QXmlStreamAttribute>.size == i) {
      qVar5 = QArrayDataPointer<QXmlStreamAttribute>::freeSpaceAtEnd
                        ((QArrayDataPointer<QXmlStreamAttribute> *)this);
      if (qVar5 == 0) goto LAB_0035cd7b;
      QXmlStreamAttribute::QXmlStreamAttribute
                ((this->super_QGenericArrayOps<QXmlStreamAttribute>).
                 super_QArrayDataPointer<QXmlStreamAttribute>.ptr +
                 (this->super_QGenericArrayOps<QXmlStreamAttribute>).
                 super_QArrayDataPointer<QXmlStreamAttribute>.size,args);
LAB_0035ce8a:
      pqVar2 = &(this->super_QGenericArrayOps<QXmlStreamAttribute>).
                super_QArrayDataPointer<QXmlStreamAttribute>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0035ce43;
    }
LAB_0035cd7b:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QXmlStreamAttribute>::freeSpaceAtBegin
                        ((QArrayDataPointer<QXmlStreamAttribute> *)this);
      if (qVar5 != 0) {
        QXmlStreamAttribute::QXmlStreamAttribute
                  ((this->super_QGenericArrayOps<QXmlStreamAttribute>).
                   super_QArrayDataPointer<QXmlStreamAttribute>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QXmlStreamAttribute>).
                   super_QArrayDataPointer<QXmlStreamAttribute>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_0035ce8a;
      }
    }
  }
  tmp._96_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.m_value.m_string.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_value.m_string.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_qualifiedName.m_string.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_value.m_string.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_qualifiedName.m_string.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_qualifiedName.m_string.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_namespaceUri.m_string.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_namespaceUri.m_string.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_name.m_string.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_namespaceUri.m_string.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_name.m_string.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_name.m_string.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QXmlStreamAttribute::QXmlStreamAttribute(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QXmlStreamAttribute>).
          super_QArrayDataPointer<QXmlStreamAttribute>.size != 0;
  QArrayDataPointer<QXmlStreamAttribute>::detachAndGrow
            ((QArrayDataPointer<QXmlStreamAttribute> *)this,(uint)(i == 0 && bVar6),1,
             (QXmlStreamAttribute **)0x0,(QArrayDataPointer<QXmlStreamAttribute> *)0x0);
  if (i == 0 && bVar6) {
    QXmlStreamAttribute::QXmlStreamAttribute
              ((this->super_QGenericArrayOps<QXmlStreamAttribute>).
               super_QArrayDataPointer<QXmlStreamAttribute>.ptr + -1,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QXmlStreamAttribute>).
               super_QArrayDataPointer<QXmlStreamAttribute>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QXmlStreamAttribute>).
              super_QArrayDataPointer<QXmlStreamAttribute>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_c0,(QArrayDataPointer<QXmlStreamAttribute> *)this,i,1);
    QXmlStreamAttribute::QXmlStreamAttribute(local_c0.displaceFrom,&tmp);
    local_c0.displaceFrom = local_c0.displaceFrom + 1;
    (local_c0.data)->size = (local_c0.data)->size + local_c0.nInserts;
  }
  QXmlStreamAttribute::~QXmlStreamAttribute(&tmp);
LAB_0035ce43:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }